

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O1

int license::CommandLineParser::parseCommandLine(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar5;
  options_description_easy_init *poVar6;
  positional_options_description *this;
  any *operand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar7;
  ostream *poVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  undefined8 *puVar10;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar11;
  size_type *psVar12;
  uint uVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmds;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  primary_key;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  project_folder;
  options_description license_desc;
  string project_folder_1;
  string project_name;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  public_key;
  parsed_options parsed;
  string templates_folder;
  variables_map vm;
  options_description global;
  positional_options_description pos;
  options_description hidden;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  Project local_3c8;
  undefined1 local_360 [40];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_338 [8];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_330 [16];
  void *local_320;
  undefined4 local_318;
  undefined8 local_310;
  undefined4 local_308;
  undefined8 local_300;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_2f8 [8];
  options_description *local_2f0;
  undefined8 local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  basic_parsed_options<char> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *local_228 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_218 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 *local_168 [2];
  undefined1 local_158 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_140 [24];
  void *local_128;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_108;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_100 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 *local_d0;
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  if (argc == 1) {
    printBasicHelp(*argv);
    return 1;
  }
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"Global options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_168,(string *)local_228,0x50,0x28);
  if (local_228[0] != local_218) {
    operator_delete(local_228[0]);
  }
  local_228[0] = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)boost::program_options::options_description::add_options
                              ((options_description *)local_168);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)local_228,"verbose,v","Turn on verbose output");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"Hidden options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)local_228,0x50,0x28);
  if (local_228[0] != local_218) {
    operator_delete(local_228[0]);
  }
  local_228[0] = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)boost::program_options::options_description::add_options
                              ((options_description *)local_b0);
  ptVar5 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
  poVar6 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_228,"command",(value_semantic *)ptVar5,
                      "command to execute: project init, project list, license list, license issue")
  ;
  ptVar5 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (poVar6,"subargs",(value_semantic *)ptVar5,
             "Arguments for command, use option --help to see");
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_e8);
  this = (positional_options_description *)
         boost::program_options::positional_options_description::add
                   ((positional_options_description *)&local_e8,"command",2);
  boost::program_options::positional_options_description::add(this,"subargs",-1);
  boost::program_options::variables_map::variables_map((variables_map *)local_228);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_360,argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((cmdline *)local_360,(options_description *)local_168);
  local_2f0 = (options_description *)local_168;
  boost::program_options::detail::cmdline::set_options_description
            ((cmdline *)local_360,(options_description *)local_b0);
  local_2f0 = (options_description *)local_b0;
  boost::program_options::detail::cmdline::set_positional_options
            ((cmdline *)local_360,(positional_options_description *)&local_e8);
  boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_360);
  boost::program_options::basic_command_line_parser<char>::run
            (&local_270,(basic_command_line_parser<char> *)local_360);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)&local_310);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_360);
  boost::program_options::store((basic_parsed_options *)&local_270,(variables_map *)local_228,false)
  ;
  pbVar2 = (pointer)(local_360 + 0x10);
  local_360._0_8_ = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"command","");
  operand = (any *)boost::program_options::abstract_variables_map::operator[]
                             ((abstract_variables_map *)local_228,(string *)local_360);
  __x = boost::
        any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                  (operand);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_408,__x);
  if ((pointer)local_360._0_8_ != pbVar2) {
    operator_delete((void *)local_360._0_8_);
  }
  if ((ulong)((long)local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    uVar13 = 1;
    printBasicHelp(*argv);
    goto LAB_00176d4a;
  }
  local_360._0_8_ = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"verbose","");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::find(local_218,(key_type *)local_360);
  if ((pointer)local_360._0_8_ != pbVar2) {
    operator_delete((void *)local_360._0_8_);
  }
  iVar4 = std::__cxx11::string::compare
                    ((char *)local_408.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar4 == 0) {
    std::__cxx11::string::substr
              ((ulong)local_360,
               (ulong)(local_408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1));
    iVar4 = std::__cxx11::string::compare(local_360);
    if ((pointer)local_360._0_8_ != pbVar2) {
      operator_delete((void *)local_360._0_8_);
    }
    if (iVar4 == 0) {
      paVar1 = &local_3c8.m_name.field_2;
      local_3f0.super_type._0_8_ = (pointer)0x14;
      local_3c8.m_name._M_dataplus._M_p = (pointer)paVar1;
      local_3c8.m_name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)&local_3f0);
      local_3c8.m_name.field_2._M_allocated_capacity = local_3f0.super_type._0_8_;
      builtin_strncpy(local_3c8.m_name._M_dataplus._M_p,"project init options",0x14);
      local_3c8.m_name._M_string_length = local_3f0.super_type._0_8_;
      local_3c8.m_name._M_dataplus._M_p[local_3f0.super_type._0_8_] = '\0';
      boost::program_options::options_description::options_description
                ((options_description *)local_360,(string *)&local_3c8,0x50,0x28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c8.m_name._M_dataplus._M_p);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_local_buf[0] = '\0';
      local_3f0.super_type._0_8_ = local_3f0.super_type._0_8_ & 0xffffffffffffff00;
      local_298.super_type.m_initialized = false;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_2d8._M_string_length = 0;
      local_2d8.field_2._M_local_buf[0] = '\0';
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_2e0 = boost::program_options::options_description::add_options
                            ((options_description *)local_360);
      ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_2b8);
      ptVar9->m_required = true;
      poVar6 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         ((options_description_easy_init *)&local_2e0,"project-name,n",
                          (value_semantic *)ptVar9,"New project name (required).");
      ptVar11 = boost::program_options::value<boost::optional<std::__cxx11::string>>(&local_3f0);
      poVar6 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         (poVar6,"primary-key",(value_semantic *)ptVar11,
                          "use externally generated primary key, public key must also be specified."
                         );
      ptVar11 = boost::program_options::value<boost::optional<std::__cxx11::string>>(&local_298);
      poVar6 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         (poVar6,"public-key",(value_semantic *)ptVar11,
                          "Use externally generated public key, private key must also be specified."
                         );
      ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_2d8);
      local_3c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x2e;
      local_3c8.m_name._M_string_length = 1;
      local_3c8.m_name._M_dataplus._M_p = (pointer)paVar1;
      ptVar9 = boost::program_options::
               typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
               ::default_value(ptVar9,&local_3c8.m_name);
      poVar6 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         (poVar6,"projects-folder,p",(value_semantic *)ptVar9,
                          "path to where all the projects configurations are stored.");
      ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_248);
      local_188.field_2._M_allocated_capacity._0_2_ = 0x2e;
      local_188._M_string_length = 1;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      ptVar9 = boost::program_options::
               typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
               ::default_value(ptVar9,&local_188);
      poVar6 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         (poVar6,"templates,t",(value_semantic *)ptVar9,
                          "path to the templates folder.");
      boost::program_options::options_description_easy_init::operator()
                (poVar6,"help","Print this help.");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c8.m_name._M_dataplus._M_p);
      }
      local_3c8.m_name.field_2._M_allocated_capacity = 0x207463656a6f7270;
      local_3c8.m_name._M_string_length = 0xc;
      local_3c8.m_name.field_2._8_5_ = 0x74696e69;
      local_3c8.m_name._M_dataplus._M_p = (pointer)paVar1;
      bVar3 = rerunBoostPO(&local_270,(options_description *)local_360,(variables_map *)local_228,
                           argv,&local_3c8.m_name,(options_description *)local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c8.m_name._M_dataplus._M_p);
      }
      if (bVar3) {
        Project::Project(&local_3c8,&local_2b8,&local_2d8,&local_248,false);
        Project::initialize(&local_3c8);
        Project::~Project(&local_3c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (local_298.super_type.m_initialized == true) {
        if (local_298.super_type.m_storage.dummy_.aligner_ !=
            (type)((long)&local_298.super_type.m_storage.dummy_ + 0x10)) {
          operator_delete((void *)local_298.super_type.m_storage.dummy_.aligner_);
        }
        local_298.super_type.m_initialized = false;
      }
      if ((options_description_easy_init)local_3f0.super_type.m_initialized ==
          (options_description_easy_init)0x1) {
        if (local_3f0.super_type.m_storage.dummy_.aligner_ !=
            (type)((long)&local_3f0.super_type.m_storage.dummy_ + 0x10)) {
          operator_delete((void *)local_3f0.super_type.m_storage.dummy_.aligner_);
        }
        local_3f0.super_type._0_8_ = local_3f0.super_type._0_8_ & 0xffffffffffffff00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      std::
      vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
      ::~vector(local_2f8);
      if (local_320 != (void *)0x0) {
        operator_delete(local_320);
        local_320 = (void *)0x0;
        local_318 = 0;
        local_310 = 0;
        local_308 = 0;
        local_300 = 0;
      }
      std::
      vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
      ::~vector(local_338);
      if ((pointer)local_360._0_8_ != pbVar2) {
        operator_delete((void *)local_360._0_8_);
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(local_408.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar4 != 0) {
        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"command ",8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((local_408.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                            (local_408.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_408.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                            local_408.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," not recognized.",0x10);
        goto LAB_00176781;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3f0
                     ,"project ",
                     local_408.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
      paVar1 = &local_3c8.m_name.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_3c8.m_name.field_2._M_allocated_capacity = *psVar12;
        local_3c8.m_name.field_2._8_8_ = puVar10[3];
        local_3c8.m_name._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3c8.m_name.field_2._M_allocated_capacity = *psVar12;
        local_3c8.m_name._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3c8.m_name._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      boost::program_options::options_description::options_description
                ((options_description *)local_360,(string *)&local_3c8,0x50,0x28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c8.m_name._M_dataplus._M_p);
      }
      if ((pointer)local_3f0.super_type._0_8_ !=
          (pointer)((long)&local_3f0.super_type.m_storage.dummy_ + 8)) {
        operator_delete((void *)local_3f0.super_type._0_8_);
      }
      local_3c8.m_name._M_dataplus._M_p = local_3c8.m_name._M_dataplus._M_p & 0xffffffffffffff00;
      local_3f0.super_type._0_8_ =
           boost::program_options::options_description::add_options
                     ((options_description *)local_360);
      ptVar11 = boost::program_options::value<boost::optional<std::__cxx11::string>>
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_3c8);
      poVar6 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         ((options_description_easy_init *)&local_3f0,"projects-folder,p",
                          (value_semantic *)ptVar11,
                          "path to where project configurations are stored.");
      boost::program_options::options_description_easy_init::operator()
                (poVar6,"help","Print this help.");
      if ((char)local_3c8.m_name._M_dataplus._M_p == '\x01') {
        if ((undefined1 *)local_3c8.m_name._M_string_length !=
            (undefined1 *)((long)&local_3c8.m_name.field_2 + 8)) {
          operator_delete((void *)local_3c8.m_name._M_string_length);
        }
        local_3c8.m_name._M_dataplus._M_p = local_3c8.m_name._M_dataplus._M_p & 0xffffffffffffff00;
      }
      boost::program_options::options_description::~options_description
                ((options_description *)local_360);
    }
    uVar13 = 0;
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((char *)local_408.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(local_408.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar4 == 0) {
        uVar13 = 0;
        issueLicense(&local_270,(variables_map *)local_228,argv,(options_description *)local_168);
        goto LAB_00176d4a;
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)local_408.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      if (iVar4 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_3f0,"test ",
                       local_408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_3f0);
        paVar1 = &local_3c8.m_name.field_2;
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_3c8.m_name.field_2._M_allocated_capacity = *psVar12;
          local_3c8.m_name.field_2._8_8_ = plVar7[3];
          local_3c8.m_name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_3c8.m_name.field_2._M_allocated_capacity = *psVar12;
          local_3c8.m_name._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_3c8.m_name._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        boost::program_options::options_description::options_description
                  ((options_description *)local_360,(string *)&local_3c8,0x50,0x28);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.m_name._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8.m_name._M_dataplus._M_p);
        }
        if ((pointer)local_3f0.super_type._0_8_ !=
            (pointer)((long)&local_3f0.super_type.m_storage.dummy_ + 8)) {
          operator_delete((void *)local_3f0.super_type._0_8_);
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)(local_408.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar4 == 0) {
          test_sign(&local_270,(variables_map *)local_228,argv,(options_description *)local_168);
        }
        uVar13 = (uint)(iVar4 != 0);
        boost::program_options::options_description::~options_description
                  ((options_description *)local_360);
        goto LAB_00176d4a;
      }
    }
LAB_00176781:
    uVar13 = 1;
    printBasicHelp(*argv);
  }
LAB_00176d4a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_270.options);
  local_228[0] = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)&PTR__variables_map_004e3448;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_1e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_218);
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_100);
  if (local_128 != (void *)0x0) {
    operator_delete(local_128);
    local_128 = (void *)0x0;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_108 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_140);
  if (local_168[0] != local_158) {
    operator_delete(local_168[0]);
  }
  return uVar13;
}

Assistant:

int CommandLineParser::parseCommandLine(int argc, const char **argv) {
	if (argc == 1) {
		printBasicHelp(argv[0]);
		return 1;
	}
	int result = 0;
	po::options_description global("Global options");
	global.add_options()("verbose,v", "Turn on verbose output");
	po::options_description hidden("Hidden options");
	hidden.add_options()("command", po::value<std::vector<std::string>>(),
						 "command to execute: project init, project list, license list, license issue")(
		"subargs", po::value<std::vector<std::string>>(), "Arguments for command, use option --help to see");

	po::positional_options_description pos;
	pos.add("command", 2).add("subargs", -1);

	po::variables_map vm;

	po::parsed_options parsed =
		po::command_line_parser(argc, argv).options(global).options(hidden).positional(pos).allow_unregistered().run();
	po::store(parsed, vm);
	std::vector<std::string> cmds = vm["command"].as<std::vector<std::string>>();
	if (cmds.size() == 0 || cmds.size() == 1) {
		printBasicHelp(argv[0]);
		return 1;
	}
	bool verbose = vm.count("verbose") > 0;
	try {
		if (cmds[0] == "project") {
			if (cmds[1].substr(0, 4) == "init") {
				initializeProject(parsed, vm, argv, global);
			} else if (cmds[1] == "list") {
				po::options_description project_desc("project " + cmds[1] + " options");
				boost::optional<string> project_folder;
				project_desc.add_options()  //
					("projects-folder,p", po::value<boost::optional<string>>(&project_folder),
					 "path to where project configurations are stored.")  //
					("help", "Print this help.");  //

			} else {
				std::cerr << endl << "command " << cmds[0] << " " << cmds[1] << " not recognized.";
				printBasicHelp(argv[0]);
				result = 1;
			}
		} else if (cmds[0] == "license") {
			if (cmds[1] == "issue") {
				issueLicense(parsed, vm, argv, global);
			} else {
				printBasicHelp(argv[0]);
				result = 1;
			}
		} else if (cmds[0] == "test") {
			po::options_description license_desc("test " + cmds[1] + " options");
			if (cmds[1] == "sign") {
				test_sign(parsed, vm, argv, global);
			} else {
				result = 1;
			}
		} else {
			printBasicHelp(argv[0]);
			result = 1;
		}
	} catch (const invalid_argument &e) {
		printBasicHelp(argv[0]);
		cout << endl << "Parameter error: " << e.what() << endl;
		result = 1;
	}
	return result;
}